

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O3

void test_cpp_bidirectional_iterator_64(void **param_1)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  type_of_iterator *ptVar3;
  unsigned_long uVar4;
  long lVar5;
  Roaring64Map roaring;
  Roaring64MapSetBitBiDirectionalIterator local_e0;
  Roaring64MapSetBitBiDirectionalIterator local_a8;
  Roaring64Map local_68;
  
  p_Var1 = &local_68.roarings._M_t._M_impl.super__Rb_tree_header;
  local_68.roarings._M_t._M_impl._0_8_ = 0;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  lVar5 = 0;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68.copyOnWrite = false;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  do {
    bVar2 = ::roaring::Roaring64Map::addChecked
                      (&local_68,*(uint64_t *)((long)&DAT_00137ba0 + lVar5));
    _assert_true((ulong)bVar2,"roaring.addChecked(values64[i])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
                 ,0x51f);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x20);
  ::roaring::Roaring64MapSetBitBiDirectionalIterator::Roaring64MapSetBitBiDirectionalIterator
            (&local_a8,&local_68,false);
  ::roaring::Roaring64MapSetBitBiDirectionalIterator::Roaring64MapSetBitBiDirectionalIterator
            (&local_e0,&local_68,false);
  local_a8.i.current_value = local_e0.i.current_value;
  local_a8.i.has_value = local_e0.i.has_value;
  local_a8.i._37_3_ = local_e0.i._37_3_;
  local_a8.p = (map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                *)CONCAT53(local_e0.p._3_5_,(uint3)local_e0.p);
  local_a8.map_iter._M_node =
       (_Base_ptr)CONCAT53(local_e0.map_iter._M_node._3_5_,local_e0.map_iter._M_node._0_3_);
  local_a8.i.typecode = local_e0.i.typecode;
  local_a8.i._17_7_ = local_e0.i._17_7_;
  local_a8.i.highbits._0_1_ = (undefined1)local_e0.i.highbits;
  local_a8.i._25_7_ = local_e0.i._25_7_;
  local_a8.i.container = local_e0.i.container;
  ::roaring::Roaring64MapSetBitBiDirectionalIterator::operator++(&local_e0,&local_a8,0);
  _assert_true((ulong)(CONCAT44(*(undefined4 *)
                                 (CONCAT53(local_e0.map_iter._M_node._3_5_,
                                           local_e0.map_iter._M_node._0_3_) + 0x20),
                                local_e0.i.current_value) == 0x7b),"*i++ == 123ULL",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
               ,0x524);
  ::roaring::Roaring64MapSetBitBiDirectionalIterator::operator++(&local_e0,&local_a8,0);
  _assert_true((ulong)(CONCAT44(*(undefined4 *)
                                 (CONCAT53(local_e0.map_iter._M_node._3_5_,
                                           local_e0.map_iter._M_node._0_3_) + 0x20),
                                local_e0.i.current_value) == 0xafffffff7),"*i++ == 0xAFFFFFFF7ULL",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
               ,0x525);
  ::roaring::Roaring64MapSetBitBiDirectionalIterator::operator++(&local_e0,&local_a8,0);
  _assert_true((ulong)(CONCAT44(*(undefined4 *)
                                 (CONCAT53(local_e0.map_iter._M_node._3_5_,
                                           local_e0.map_iter._M_node._0_3_) + 0x20),
                                local_e0.i.current_value) == 0xfffffffff),"*i++ == 0xFFFFFFFFFULL",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
               ,0x526);
  ::roaring::Roaring64MapSetBitBiDirectionalIterator::operator++(&local_e0,&local_a8,0);
  _assert_true((ulong)(CONCAT44(*(undefined4 *)
                                 (CONCAT53(local_e0.map_iter._M_node._3_5_,
                                           local_e0.map_iter._M_node._0_3_) + 0x20),
                                local_e0.i.current_value) == 0xa00000000a),"*i++ == 0xA00000000AULL"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
               ,0x527);
  _assert_true((ulong)((_Rb_tree_header *)local_a8.map_iter._M_node ==
                      &((local_a8.p)->_M_t)._M_impl.super__Rb_tree_header),"i == roaring.end()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
               ,0x528);
  ptVar3 = ::roaring::Roaring64MapSetBitBiDirectionalIterator::operator--(&local_a8);
  _assert_true((ulong)(CONCAT44((ptVar3->map_iter)._M_node[1]._M_color,(ptVar3->i).current_value) ==
                      0xa00000000a),"*--i == 0xA00000000AULL",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
               ,0x529);
  ptVar3 = ::roaring::Roaring64MapSetBitBiDirectionalIterator::operator--(&local_a8);
  _assert_true((ulong)(CONCAT44((ptVar3->map_iter)._M_node[1]._M_color,(ptVar3->i).current_value) ==
                      0xfffffffff),"*--i == 0xFFFFFFFFFULL",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
               ,0x52a);
  ptVar3 = ::roaring::Roaring64MapSetBitBiDirectionalIterator::operator--(&local_a8);
  _assert_true((ulong)(CONCAT44((ptVar3->map_iter)._M_node[1]._M_color,(ptVar3->i).current_value) ==
                      0xafffffff7),"*--i == 0xAFFFFFFF7ULL",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
               ,0x52b);
  ptVar3 = ::roaring::Roaring64MapSetBitBiDirectionalIterator::operator--(&local_a8);
  _assert_true((ulong)(CONCAT44((ptVar3->map_iter)._M_node[1]._M_color,(ptVar3->i).current_value) ==
                      0x7b),"*--i == 123ULL",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
               ,0x52c);
  ::roaring::Roaring64MapSetBitBiDirectionalIterator::Roaring64MapSetBitBiDirectionalIterator
            (&local_e0,&local_68,false);
  if (((_Rb_tree_header *)local_a8.map_iter._M_node ==
       &((local_a8.p)->_M_t)._M_impl.super__Rb_tree_header) &&
     (CONCAT53(local_e0.map_iter._M_node._3_5_,local_e0.map_iter._M_node._0_3_) ==
      CONCAT53(local_e0.p._3_5_,(uint3)local_e0.p) + 8)) {
    uVar4 = 1;
  }
  else if (CONCAT53(local_e0.map_iter._M_node._3_5_,local_e0.map_iter._M_node._0_3_) ==
           CONCAT53(local_e0.p._3_5_,(uint3)local_e0.p) + 8) {
    uVar4 = 0;
  }
  else {
    uVar4 = (unsigned_long)
            (CONCAT44(local_a8.map_iter._M_node[1]._M_color,local_a8.i.current_value) ==
            CONCAT44(*(undefined4 *)
                      (CONCAT53(local_e0.map_iter._M_node._3_5_,local_e0.map_iter._M_node._0_3_) +
                      0x20),local_e0.i.current_value));
  }
  _assert_true(uVar4,"i == roaring.begin()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
               ,0x52d);
  local_a8.i.parent = (roaring_bitmap_t *)0x0;
  local_a8.i.container = (container_s *)0x0;
  local_a8.i.typecode = '\0';
  local_e0.p._3_5_ = 0;
  local_e0.map_iter._M_node._0_3_ = 0;
  local_e0.map_iter._M_node._3_5_ = 0;
  local_e0.i.parent._0_4_ = 0;
  local_a8.i.container_index = 0;
  local_a8.i._17_3_ = (uint3)local_e0.p;
  local_a8.i.highbits._0_1_ = 0;
  local_a8.i._25_7_ = 0;
  local_a8.i.current_value = 0;
  local_a8.i._36_4_ = local_a8.i._36_4_ & 0xffffff00;
  local_a8.p = &local_68.roarings;
  local_a8.map_iter._M_node = &p_Var1->_M_header;
  ::roaring::Roaring64MapSetBitBiDirectionalIterator::operator--(&local_e0,&local_a8,0);
  ::roaring::Roaring64MapSetBitBiDirectionalIterator::operator--(&local_e0,&local_a8,0);
  _assert_true((ulong)(CONCAT44(*(undefined4 *)
                                 (CONCAT53(local_e0.map_iter._M_node._3_5_,
                                           local_e0.map_iter._M_node._0_3_) + 0x20),
                                local_e0.i.current_value) == 0xa00000000a),"*i-- == 0xA00000000AULL"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
               ,0x530);
  ::roaring::Roaring64MapSetBitBiDirectionalIterator::operator--(&local_e0,&local_a8,0);
  _assert_true((ulong)(CONCAT44(*(undefined4 *)
                                 (CONCAT53(local_e0.map_iter._M_node._3_5_,
                                           local_e0.map_iter._M_node._0_3_) + 0x20),
                                local_e0.i.current_value) == 0xfffffffff),"*i-- == 0xFFFFFFFFFULL",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
               ,0x531);
  ::roaring::Roaring64MapSetBitBiDirectionalIterator::operator--(&local_e0,&local_a8,0);
  _assert_true((ulong)(CONCAT44(*(undefined4 *)
                                 (CONCAT53(local_e0.map_iter._M_node._3_5_,
                                           local_e0.map_iter._M_node._0_3_) + 0x20),
                                local_e0.i.current_value) == 0xafffffff7),"*i-- == 0xAFFFFFFF7ULL",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
               ,0x532);
  _assert_true((ulong)(CONCAT44(local_a8.map_iter._M_node[1]._M_color,local_a8.i.current_value) ==
                      0x7b),"*i == 123ULL",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
               ,0x533);
  ::roaring::Roaring64MapSetBitBiDirectionalIterator::Roaring64MapSetBitBiDirectionalIterator
            (&local_e0,&local_68,false);
  if (((_Rb_tree_header *)local_a8.map_iter._M_node ==
       &(((roarings_t *)&(local_a8.p)->_M_t)->_M_t)._M_impl.super__Rb_tree_header) &&
     (CONCAT53(local_e0.map_iter._M_node._3_5_,local_e0.map_iter._M_node._0_3_) ==
      CONCAT53(local_e0.p._3_5_,(uint3)local_e0.p) + 8)) {
    uVar4 = 1;
  }
  else if (CONCAT53(local_e0.map_iter._M_node._3_5_,local_e0.map_iter._M_node._0_3_) ==
           CONCAT53(local_e0.p._3_5_,(uint3)local_e0.p) + 8) {
    uVar4 = 0;
  }
  else {
    uVar4 = (unsigned_long)
            (CONCAT44(local_a8.map_iter._M_node[1]._M_color,local_a8.i.current_value) ==
            CONCAT44(*(undefined4 *)
                      (CONCAT53(local_e0.map_iter._M_node._3_5_,local_e0.map_iter._M_node._0_3_) +
                      0x20),local_e0.i.current_value));
  }
  _assert_true(uVar4,"i == roaring.begin()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
               ,0x534);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_68);
  return;
}

Assistant:

DEFINE_TEST(test_example_true) { test_example(true); }